

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

string * showVec_abi_cxx11_(vec<int> *v)

{
  uint uVar1;
  int *piVar2;
  vec<int> *in_RSI;
  string *in_RDI;
  uint i;
  stringstream ss;
  uint local_19c;
  stringstream local_198 [16];
  ostream local_188 [376];
  vec<int> *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_19c = 0;
  while( true ) {
    uVar1 = vec<int>::size(local_10);
    if (uVar1 <= local_19c) break;
    if (local_19c != 0) {
      std::operator<<(local_188," ");
    }
    piVar2 = vec<int>::operator[](local_10,local_19c);
    std::ostream::operator<<(local_188,*piVar2);
    local_19c = local_19c + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string showVec(const vec<int>& v) {
	std::stringstream ss;
	for (unsigned int i = 0; i < v.size(); i++) {
		if (i > 0) {
			ss << " ";
		}
		ss << v[i];
	}
	return ss.str();
}